

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utXImporterExporter.cpp
# Opt level: O0

void __thiscall
utXImporterExporter_heap_overflow_in_tokenizer_Test::TestBody
          (utXImporterExporter_heap_overflow_in_tokenizer_Test *this)

{
  bool bVar1;
  AssertHelper local_38;
  Message local_30 [3];
  Importer local_18;
  Importer importer;
  utXImporterExporter_heap_overflow_in_tokenizer_Test *this_local;
  
  importer.pimpl = (ImporterPimpl *)this;
  Assimp::Importer::Importer(&local_18);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      Assimp::Importer::ReadFile
                (&local_18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/X/OV_GetNextToken"
                 ,0);
    }
  }
  else {
    testing::Message::Message(local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utXImporterExporter.cpp"
               ,0x44,
               "Expected: importer.ReadFile( \"/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models\" \"/X/OV_GetNextToken\", 0 ) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_38,local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::Message::~Message(local_30);
  }
  Assimp::Importer::~Importer(&local_18);
  return;
}

Assistant:

TEST_F( utXImporterExporter, heap_overflow_in_tokenizer ) {
    Assimp::Importer importer;
    EXPECT_NO_THROW( importer.ReadFile( ASSIMP_TEST_MODELS_DIR "/X/OV_GetNextToken", 0 ) );
}